

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O1

void __thiscall Game::play(Game *this)

{
  int iVar1;
  GameResult GVar2;
  
  printIntro(this);
  if ((this->gameResult).bulls != 4) {
    iVar1 = this->guessCount;
    while (iVar1 < 0xf) {
      GVar2 = getGuess(this);
      this->gameResult = GVar2;
      this->guessCount = this->guessCount + 1;
      printGuessResult(this);
      if ((this->gameResult).bulls == 4) break;
      iVar1 = this->guessCount;
    }
  }
  promptUserToPlayAgain(this);
  if (this->wantsToPlay != true) {
    return;
  }
  resetGame(this);
  return;
}

Assistant:

void Game::play()
{
	printIntro();
	// while player has not won or limit of retries has not been reached
	while (not hasWon() and hasTries()) // play the game
	{
		gameResult = getGuess();
		++guessCount;
		printGuessResult();
	}
	promptUserToPlayAgain();
	if (wantsToPlay)
		resetGame();
}